

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v10::detail::write_int_noinline<char,fmt::v10::appender,unsigned_int>
                   (appender out,write_int_arg<unsigned_int> arg,format_specs<char> *specs,
                   locale_ref loc)

{
  presentation_type pVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar6;
  appender aVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  anon_class_8_2_0dfc6556_for_write_digits aVar11;
  ulong uVar12;
  anon_class_8_2_0dfc6556_for_write_digits local_70;
  bool local_68;
  undefined1 local_60 [32];
  bool local_40;
  write_int_data<char> data;
  
  pVar1 = specs->type;
  if (pVar1 < string) {
    uVar12 = (ulong)arg >> 0x20;
    uVar4 = arg.prefix;
    uVar5 = arg.abs_value;
    switch(pVar1) {
    case none:
    case dec:
      uVar3 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar10 = *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar3 * 8) +
               ((ulong)arg & 0xffffffff);
      aVar11 = (anon_class_8_2_0dfc6556_for_write_digits)
               (uVar10 & 0xffffffff00000000 | (ulong)arg & 0xffffffff);
      iVar9 = (int)(uVar10 >> 0x20);
      local_70 = aVar11;
      if (specs->precision == -1 && specs->width == 0) {
        to_unsigned<int>(iVar9);
        if (uVar12 != 0) {
          for (uVar4 = uVar4 & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
            local_60[0] = (char)uVar4;
            buffer<char>::push_back
                      ((buffer<char> *)
                       out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                       local_60);
          }
        }
        bVar6.container =
             (buffer<char> *)
             write_int<fmt::v10::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/evaikene[P]filefind/fmt/format.h:2218:41)>
             ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                       (&local_70,
                        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      }
      else {
        write_int_data<char>::write_int_data(&data,iVar9,uVar4,specs);
        local_60._8_8_ = data.size;
        local_60._16_8_ = data.padding;
        local_60._0_4_ = uVar4;
        local_60._24_8_ = aVar11;
        bVar6.container =
             (buffer<char> *)
             write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_)::_lambda(fmt::v10::appender)_1_>
                       (out,specs,data.size,(anon_class_32_3_03e05ccd *)local_60);
      }
      break;
    case oct:
      iVar9 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> iVar9 == 0; iVar9 = iVar9 + -1) {
        }
      }
      bVar2 = (char)(((ushort)iVar9 & 0xff) / 3) + 1;
      if (((specs->field_0x9 & 0x80) != 0) && (uVar5 != 0 && specs->precision <= (int)(uint)bVar2))
      {
        uVar5 = 0x3000;
        if (uVar12 == 0) {
          uVar5 = 0x30;
        }
        uVar4 = (uVar5 | uVar4) + 0x1000000;
      }
      aVar11 = (anon_class_8_2_0dfc6556_for_write_digits)
               ((ulong)arg & 0xffffffff | (ulong)bVar2 << 0x20);
      local_70 = aVar11;
      if (specs->precision == -1 && specs->width == 0) {
        to_unsigned<int>((uint)bVar2);
        if (uVar4 != 0) {
          for (uVar4 = uVar4 & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
            local_60[0] = (char)uVar4;
            buffer<char>::push_back
                      ((buffer<char> *)
                       out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                       local_60);
          }
        }
        bVar6.container =
             (buffer<char> *)
             write_int<fmt::v10::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/evaikene[P]filefind/fmt/format.h:2251:22)>
             ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                       ((anon_class_8_2_0dfc6556_for_write_digits *)&local_70,
                        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      }
      else {
        write_int_data<char>::write_int_data(&data,(uint)bVar2,uVar4,specs);
        local_60._8_8_ = data.size;
        local_60._16_8_ = data.padding;
        local_60._0_4_ = uVar4;
        local_60._24_8_ = aVar11;
        bVar6.container =
             (buffer<char> *)
             write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_)::_lambda(fmt::v10::appender)_1_>
                       (out,specs,data.size,(anon_class_32_3_03e05ccd *)local_60);
      }
      break;
    case hex_lower:
    case hex_upper:
      local_68 = pVar1 == hex_upper;
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar8 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
        uVar3 = uVar8 << 8;
        if (uVar12 == 0) {
          uVar3 = uVar8;
        }
        uVar4 = (uVar3 | uVar4) + 0x2000000;
      }
      uVar3 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar5 = 8 - ((uVar3 ^ 0x1c) >> 2);
      local_70 = (anon_class_8_2_0dfc6556_for_write_digits)
                 ((ulong)arg & 0xffffffff | (ulong)uVar5 << 0x20);
      if (specs->precision == -1 && specs->width == 0) {
        to_unsigned<int>(uVar5);
        if (uVar4 != 0) {
          for (uVar4 = uVar4 & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
            local_60[0] = (char)uVar4;
            buffer<char>::push_back
                      ((buffer<char> *)
                       out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                       local_60);
          }
        }
        bVar6.container =
             (buffer<char> *)
             write_int<fmt::v10::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/evaikene[P]filefind/fmt/format.h:2229:41)>
             ::anon_class_40_3_03e05ccd::anon_class_12_3_01816715_for_write_digits::operator()
                       ((anon_class_12_3_01816715_for_write_digits *)&local_70,
                        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      }
      else {
        write_int_data<char>::write_int_data(&data,uVar5,uVar4,specs);
        local_60._8_8_ = data.size;
        local_60._16_8_ = data.padding;
        local_60._24_4_ = local_70.abs_value;
        local_60._28_4_ = local_70.num_digits;
        local_40 = local_68;
        local_60._0_4_ = uVar4;
        bVar6.container =
             (buffer<char> *)
             write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_)::_lambda(fmt::v10::appender)_1_>
                       (out,specs,data.size,(anon_class_40_3_03e05ccd *)local_60);
      }
      break;
    case bin_lower:
    case bin_upper:
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar8 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
        uVar3 = uVar8 << 8;
        if (uVar12 == 0) {
          uVar3 = uVar8;
        }
        uVar4 = (uVar3 | uVar4) + 0x2000000;
      }
      uVar3 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar5 = (uVar3 ^ 0xffffffe0) + 0x21;
      aVar11 = (anon_class_8_2_0dfc6556_for_write_digits)
               ((ulong)arg & 0xffffffff | (ulong)uVar5 << 0x20);
      local_70 = aVar11;
      if (specs->precision == -1 && specs->width == 0) {
        to_unsigned<int>(uVar5);
        if (uVar4 != 0) {
          for (uVar4 = uVar4 & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
            local_60[0] = (char)uVar4;
            buffer<char>::push_back
                      ((buffer<char> *)
                       out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                       local_60);
          }
        }
        bVar6.container =
             (buffer<char> *)
             write_int<fmt::v10::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/evaikene[P]filefind/fmt/format.h:2240:22)>
             ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                       ((anon_class_8_2_0dfc6556_for_write_digits *)&local_70,
                        out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      }
      else {
        write_int_data<char>::write_int_data(&data,uVar5,uVar4,specs);
        local_60._8_8_ = data.size;
        local_60._16_8_ = data.padding;
        local_60._0_4_ = uVar4;
        local_60._24_8_ = aVar11;
        bVar6.container =
             (buffer<char> *)
             write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_int>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_int>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_)::_lambda(fmt::v10::appender)_1_>
                       (out,specs,data.size,(anon_class_32_3_03e05ccd *)local_60);
      }
      break;
    default:
      goto switchD_0010f70e_caseD_7;
    case chr:
      aVar7 = write_char<char,fmt::v10::appender>(out,(char)arg.abs_value,specs);
      return (appender)aVar7.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    }
    return (appender)bVar6.container;
  }
switchD_0010f70e_caseD_7:
  throw_format_error("invalid format specifier");
}

Assistant:

FMT_CONSTEXPR FMT_INLINE auto write_int(OutputIt out, write_int_arg<T> arg,
                                        const format_specs<Char>& specs,
                                        locale_ref) -> OutputIt {
  static_assert(std::is_same<T, uint32_or_64_or_128_t<T>>::value, "");
  auto abs_value = arg.abs_value;
  auto prefix = arg.prefix;
  switch (specs.type) {
  case presentation_type::none:
  case presentation_type::dec: {
    auto num_digits = count_digits(abs_value);
    return write_int(
        out, num_digits, prefix, specs, [=](reserve_iterator<OutputIt> it) {
          return format_decimal<Char>(it, abs_value, num_digits).end;
        });
  }
  case presentation_type::hex_lower:
  case presentation_type::hex_upper: {
    bool upper = specs.type == presentation_type::hex_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'X' : 'x') << 8 | '0');
    int num_digits = count_digits<4>(abs_value);
    return write_int(
        out, num_digits, prefix, specs, [=](reserve_iterator<OutputIt> it) {
          return format_uint<4, Char>(it, abs_value, num_digits, upper);
        });
  }
  case presentation_type::bin_lower:
  case presentation_type::bin_upper: {
    bool upper = specs.type == presentation_type::bin_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'B' : 'b') << 8 | '0');
    int num_digits = count_digits<1>(abs_value);
    return write_int(out, num_digits, prefix, specs,
                     [=](reserve_iterator<OutputIt> it) {
                       return format_uint<1, Char>(it, abs_value, num_digits);
                     });
  }
  case presentation_type::oct: {
    int num_digits = count_digits<3>(abs_value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && abs_value != 0)
      prefix_append(prefix, '0');
    return write_int(out, num_digits, prefix, specs,
                     [=](reserve_iterator<OutputIt> it) {
                       return format_uint<3, Char>(it, abs_value, num_digits);
                     });
  }
  case presentation_type::chr:
    return write_char(out, static_cast<Char>(abs_value), specs);
  default:
    throw_format_error("invalid format specifier");
  }
  return out;
}